

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatingCodec.cc
# Opt level: O0

size_t __thiscall
avro::parsing::ValidatingDecoder<avro::parsing::SimpleParser<avro::parsing::DummyHandler>_>::skipMap
          (ValidatingDecoder<avro::parsing::SimpleParser<avro::parsing::DummyHandler>_> *this)

{
  int iVar1;
  type pDVar2;
  undefined4 extraout_var;
  long in_RDI;
  size_t n;
  size_t in_stack_00000028;
  SimpleParser<avro::parsing::DummyHandler> *in_stack_00000030;
  Kind in_stack_00000264;
  SimpleParser<avro::parsing::DummyHandler> *in_stack_00000268;
  Decoder *in_stack_000002c8;
  SimpleParser<avro::parsing::DummyHandler> *in_stack_000002d0;
  
  SimpleParser<avro::parsing::DummyHandler>::advance(in_stack_00000268,in_stack_00000264);
  pDVar2 = boost::shared_ptr<avro::Decoder>::operator->((shared_ptr<avro::Decoder> *)(in_RDI + 8));
  iVar1 = (*pDVar2->_vptr_Decoder[0x15])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    SimpleParser<avro::parsing::DummyHandler>::pop
              ((SimpleParser<avro::parsing::DummyHandler> *)0x200f66);
  }
  else {
    SimpleParser<avro::parsing::DummyHandler>::setRepeatCount(in_stack_00000030,in_stack_00000028);
    boost::shared_ptr<avro::Decoder>::operator*((shared_ptr<avro::Decoder> *)(in_RDI + 8));
    SimpleParser<avro::parsing::DummyHandler>::skip(in_stack_000002d0,in_stack_000002c8);
  }
  SimpleParser<avro::parsing::DummyHandler>::advance(in_stack_00000268,in_stack_00000264);
  return 0;
}

Assistant:

size_t ValidatingDecoder<P>::skipMap()
{
    parser.advance(Symbol::sMapStart);
    size_t n = base->skipMap();
    if (n == 0) {
        parser.pop();
    } else {
        parser.setRepeatCount(n);
        parser.skip(*base);
    }
    parser.advance(Symbol::sMapEnd);
    return 0;
}